

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_twin_messenger.c
# Opt level: O1

void twin_messenger_do_work(TWIN_MESSENGER_HANDLE twin_msgr_handle)

{
  TWIN_OPERATION_TYPE TVar1;
  TWIN_MESSENGER_STATE TVar2;
  int iVar3;
  LOGGER_LOG p_Var4;
  TWIN_OPERATION_CONTEXT *twin_op_ctx;
  TWIN_OPERATION_TYPE TVar5;
  TWIN_MESSENGER_STATE previous_state;
  char *pcVar6;
  TWIN_OPERATION_TYPE TVar7;
  char *pcVar8;
  time_t local_28;
  
  if (twin_msgr_handle == (TWIN_MESSENGER_HANDLE)0x0) {
    return;
  }
  if (twin_msgr_handle->state != TWIN_MESSENGER_STATE_STARTED) goto LAB_0013b413;
  singlylinkedlist_remove_if
            (twin_msgr_handle->pending_patches,send_pending_twin_patch,twin_msgr_handle);
  if (twin_msgr_handle->subscription_error_count < 3) {
    TVar1 = twin_msgr_handle->subscription_state;
    TVar5 = TVar1;
    if (TVar1 == TWIN_OPERATION_TYPE_GET) {
      TVar7 = TWIN_OPERATION_TYPE_GET_ON_DEMAND;
    }
    else if (TVar1 == (TWIN_OPERATION_TYPE_PUT|TWIN_OPERATION_TYPE_GET_ON_DEMAND)) {
      TVar7 = 8;
      TVar5 = TWIN_OPERATION_TYPE_PUT;
    }
    else if (TVar1 == TWIN_OPERATION_TYPE_PUT) {
      TVar7 = TWIN_OPERATION_TYPE_DELETE;
    }
    else {
      TVar5 = TWIN_OPERATION_TYPE_PATCH;
      TVar7 = TVar1;
    }
    if (TVar7 == TVar1) goto LAB_0013b413;
    twin_op_ctx = create_twin_operation_context(twin_msgr_handle,TVar5);
    if (twin_op_ctx == (TWIN_OPERATION_CONTEXT *)0x0) {
      p_Var4 = xlogging_get_log_function();
      if (p_Var4 != (LOGGER_LOG)0x0) {
        pcVar6 = "Failed creating a context for TWIN request (%s, %s)";
        iVar3 = 0x4b8;
        pcVar8 = TWIN_OPERATION_TYPEStringStorage[TVar5];
        goto LAB_0013b26c;
      }
    }
    else {
      iVar3 = add_twin_operation_context_to_queue(twin_op_ctx);
      if (iVar3 == 0) {
        iVar3 = send_twin_operation_request(twin_msgr_handle,twin_op_ctx,(CONSTBUFFER_HANDLE)0x0);
        if (iVar3 == 0) {
          twin_msgr_handle->subscription_state = TVar7;
          goto LAB_0013b413;
        }
        p_Var4 = xlogging_get_log_function();
        if (p_Var4 != (LOGGER_LOG)0x0) {
          (*p_Var4)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
                    ,"process_twin_subscription",0x4c5,1,"Failed sending TWIN request (%s, %s)",
                    twin_msgr_handle->device_id,TWIN_OPERATION_TYPEStringStorage[TVar5]);
        }
        remove_twin_operation_context_from_queue(twin_op_ctx);
      }
      else {
        p_Var4 = xlogging_get_log_function();
        if (p_Var4 != (LOGGER_LOG)0x0) {
          (*p_Var4)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
                    ,"process_twin_subscription",0x4bf,1,
                    "Failed queueing TWIN request context (%s, %s)",twin_msgr_handle->device_id,
                    TWIN_OPERATION_TYPEStringStorage[TVar5]);
        }
      }
      free(twin_op_ctx->correlation_id);
      free(twin_op_ctx);
    }
  }
  else {
    p_Var4 = xlogging_get_log_function();
    if (p_Var4 != (LOGGER_LOG)0x0) {
      pcVar6 = "Maximum number of TWIN subscription-related failures reached (%s, %lu)";
      iVar3 = 0x49a;
      pcVar8 = (char *)twin_msgr_handle->subscription_error_count;
LAB_0013b26c:
      (*p_Var4)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
                ,"process_twin_subscription",iVar3,1,pcVar6,twin_msgr_handle->device_id,pcVar8);
    }
  }
  TVar2 = twin_msgr_handle->state;
  if (TVar2 != TWIN_MESSENGER_STATE_ERROR) {
    twin_msgr_handle->state = TWIN_MESSENGER_STATE_ERROR;
    if (twin_msgr_handle->on_state_changed_callback != (TWIN_MESSENGER_STATE_CHANGED_CALLBACK)0x0) {
      (*twin_msgr_handle->on_state_changed_callback)
                (twin_msgr_handle->on_state_changed_context,TVar2,TWIN_MESSENGER_STATE_ERROR);
    }
  }
LAB_0013b413:
  local_28 = get_time((time_t *)0x0);
  if (local_28 == -1) {
    p_Var4 = xlogging_get_log_function();
    if (p_Var4 != (LOGGER_LOG)0x0) {
      (*p_Var4)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
                ,"process_timeouts",0x44c,1,"Failed obtaining current time (%s)",
                twin_msgr_handle->device_id);
    }
    TVar2 = twin_msgr_handle->state;
    if (TVar2 != TWIN_MESSENGER_STATE_ERROR) {
      twin_msgr_handle->state = TWIN_MESSENGER_STATE_ERROR;
      if (twin_msgr_handle->on_state_changed_callback != (TWIN_MESSENGER_STATE_CHANGED_CALLBACK)0x0)
      {
        (*twin_msgr_handle->on_state_changed_callback)
                  (twin_msgr_handle->on_state_changed_context,TVar2,TWIN_MESSENGER_STATE_ERROR);
      }
    }
  }
  else {
    singlylinkedlist_remove_if
              (twin_msgr_handle->pending_patches,remove_expired_twin_patch_request,&local_28);
    singlylinkedlist_remove_if
              (twin_msgr_handle->operations,remove_expired_twin_operation_request,&local_28);
  }
  amqp_messenger_do_work(twin_msgr_handle->amqp_msgr);
  return;
}

Assistant:

void twin_messenger_do_work(TWIN_MESSENGER_HANDLE twin_msgr_handle)
{
    if (twin_msgr_handle != NULL)
    {
        TWIN_MESSENGER_INSTANCE* twin_msgr = (TWIN_MESSENGER_INSTANCE*)twin_msgr_handle;

        if (twin_msgr->state == TWIN_MESSENGER_STATE_STARTED)
        {
            (void)singlylinkedlist_remove_if(twin_msgr->pending_patches, send_pending_twin_patch, (const void*)twin_msgr);

            process_twin_subscription(twin_msgr);
        }

        process_timeouts(twin_msgr);

        amqp_messenger_do_work(twin_msgr->amqp_msgr);
    }
}